

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O0

void reset_enc_task(MppEncImpl *enc)

{
  MppEncHeaderStatus MVar1;
  MppEncImpl *enc_local;
  
  enc->task_in = (MppTask)0x0;
  enc->task_out = (MppTask)0x0;
  enc->packet = (MppPacket)0x0;
  enc->frame = (MppFrame)0x0;
  enc->frm_buf = (MppBuffer)0x0;
  enc->pkt_buf = (MppBuffer)0x0;
  MVar1.val._1_3_ = 0;
  MVar1.val._0_1_ = *(byte *)&enc->hdr_status & 1;
  enc->hdr_status = MVar1;
  return;
}

Assistant:

static void reset_enc_task(MppEncImpl *enc)
{
    enc->task_in = NULL;
    enc->task_out = NULL;
    enc->packet = NULL;
    enc->frame = NULL;

    enc->frm_buf = NULL;
    enc->pkt_buf = NULL;

    /* NOTE: clear add_by flags */
    enc->hdr_status.val = enc->hdr_status.ready;
}